

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileHelpers.cpp
# Opt level: O0

bool helics::fileops::looksLikeFile(string_view configString)

{
  bool bVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  undefined8 in_RDI;
  char __c;
  undefined1 in_stack_00000058 [16];
  
  __c = (char)((ulong)in_RDI >> 0x38);
  bVar1 = hasTomlExtension((string_view)in_stack_00000058);
  if (((!bVar1) && (bVar1 = hasJsonExtension((string_view)in_stack_00000058), !bVar1)) &&
     (sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        (in_RSI,__c,0x779546), sVar2 == 0xffffffffffffffff)) {
    return false;
  }
  return true;
}

Assistant:

bool looksLikeFile(std::string_view configString)
{
    if (helics::fileops::hasTomlExtension(configString)) {
        return true;
    }
    if ((helics::fileops::hasJsonExtension(configString)) ||
        (configString.find_first_of('{') != std::string_view::npos)) {
        return true;
    }
    return false;
}